

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void jcopy_markers_execute(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JCOPY_OPTION option)

{
  jpeg_saved_marker_ptr_conflict pjVar1;
  JOCTET *pJVar2;
  UINT8 UVar3;
  
  for (pjVar1 = srcinfo->marker_list; pjVar1 != (jpeg_saved_marker_ptr_conflict)0x0;
      pjVar1 = pjVar1->next) {
    if (((((dstinfo->write_JFIF_header == 0) || (pjVar1->marker != 0xe0)) ||
         (pjVar1->data_length < 5)) ||
        (((pJVar2 = pjVar1->data, *pJVar2 != 'J' || (pJVar2[1] != 'F')) ||
         ((pJVar2[2] != 'I' || ((pJVar2[3] != 'F' || (pJVar2[4] != '\0')))))))) &&
       ((UVar3 = pjVar1->marker, dstinfo->write_Adobe_marker == 0 ||
        (((((UVar3 != 0xee || (UVar3 = 0xee, pjVar1->data_length < 5)) ||
           (pJVar2 = pjVar1->data, *pJVar2 != 'A')) || ((pJVar2[1] != 'd' || (pJVar2[2] != 'o'))))
         || ((pJVar2[3] != 'b' || (pJVar2[4] != 'e')))))))) {
      jpeg_write_marker(dstinfo,UVar3,pjVar1->data,pjVar1->data_length);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_markers_execute(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                      JCOPY_OPTION option)
{
  jpeg_saved_marker_ptr marker;

  /* In the current implementation, we don't actually need to examine the
   * option flag here; we just copy everything that got saved.
   * But to avoid confusion, we do not output JFIF and Adobe APP14 markers
   * if the encoder library already wrote one.
   */
  for (marker = srcinfo->marker_list; marker != NULL; marker = marker->next) {
    if (dstinfo->write_JFIF_header &&
        marker->marker == JPEG_APP0 &&
        marker->data_length >= 5 &&
        marker->data[0] == 0x4A &&
        marker->data[1] == 0x46 &&
        marker->data[2] == 0x49 &&
        marker->data[3] == 0x46 &&
        marker->data[4] == 0)
      continue;                 /* reject duplicate JFIF */
    if (dstinfo->write_Adobe_marker &&
        marker->marker == JPEG_APP0 + 14 &&
        marker->data_length >= 5 &&
        marker->data[0] == 0x41 &&
        marker->data[1] == 0x64 &&
        marker->data[2] == 0x6F &&
        marker->data[3] == 0x62 &&
        marker->data[4] == 0x65)
      continue;                 /* reject duplicate Adobe */
    jpeg_write_marker(dstinfo, marker->marker,
                      marker->data, marker->data_length);
  }
}